

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeRelease(Rtree *pRtree,RtreeNode *pNode)

{
  Rtree *in_RSI;
  RtreeNode *in_RDI;
  int rc;
  Rtree *unaff_retaddr;
  uint in_stack_ffffffffffffffe8;
  int iVar1;
  
  iVar1 = 0;
  if ((in_RSI != (Rtree *)0x0) &&
     (*(int *)&(in_RSI->base).zErrMsg = *(int *)&(in_RSI->base).zErrMsg + -1,
     *(int *)&(in_RSI->base).zErrMsg == 0)) {
    *(int *)((long)&in_RDI[2].iNode + 4) = *(int *)((long)&in_RDI[2].iNode + 4) + -1;
    if (*(long *)&(in_RSI->base).nRef == 1) {
      *(undefined4 *)((long)&in_RDI[1].pParent + 4) = 0xffffffff;
    }
    if ((in_RSI->base).pModule != (sqlite3_module *)0x0) {
      iVar1 = nodeRelease(in_RSI,(RtreeNode *)(ulong)in_stack_ffffffffffffffe8);
    }
    if (iVar1 == 0) {
      iVar1 = nodeWrite(unaff_retaddr,in_RDI);
    }
    nodeHashDelete(unaff_retaddr,in_RDI);
    sqlite3_free((void *)0x29a055);
  }
  return iVar1;
}

Assistant:

static int nodeRelease(Rtree *pRtree, RtreeNode *pNode){
  int rc = SQLITE_OK;
  if( pNode ){
    assert( pNode->nRef>0 );
    assert( pRtree->nNodeRef>0 );
    pNode->nRef--;
    if( pNode->nRef==0 ){
      pRtree->nNodeRef--;
      if( pNode->iNode==1 ){
        pRtree->iDepth = -1;
      }
      if( pNode->pParent ){
        rc = nodeRelease(pRtree, pNode->pParent);
      }
      if( rc==SQLITE_OK ){
        rc = nodeWrite(pRtree, pNode);
      }
      nodeHashDelete(pRtree, pNode);
      sqlite3_free(pNode);
    }
  }
  return rc;
}